

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_sifm.cc
# Opt level: O0

void __thiscall hwtest::pgraph::anon_unknown_17::MthdSifmFormat::emulate_mthd(MthdSifmFormat *this)

{
  bool bVar1;
  uint32_t local_18;
  uint local_14;
  int fmt;
  int sfmt;
  MthdSifmFormat *this_local;
  
  local_14 = (this->super_SingleMthdTest).super_MthdTest.val & 7;
  if (0xf < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test.
            chipset.card_type) {
    local_14 = (this->super_SingleMthdTest).super_MthdTest.val & 0xf;
  }
  local_18 = 0;
  if (local_14 == 1) {
    local_18 = 6;
  }
  if (local_14 == 2) {
    local_18 = 7;
  }
  if (local_14 == 3) {
    local_18 = 0xd;
  }
  if (local_14 == 4) {
    local_18 = 0xe;
  }
  if (local_14 == 5) {
    local_18 = 0x12;
  }
  if (local_14 == 6) {
    local_18 = 0x13;
  }
  if (local_14 == 7) {
    local_18 = 10;
  }
  if (local_14 == 8) {
    local_18 = 1;
  }
  if (local_14 == 9) {
    local_18 = 0x15;
  }
  bVar1 = nv04_pgraph_is_nv11p
                    (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                      super_Test.chipset);
  if (bVar1) {
    if (local_14 == 10) {
      local_18 = 0x16;
    }
    if (local_14 == 0xb) {
      local_18 = 0x17;
    }
  }
  if (0x2f < (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test
             .chipset.card_type) {
    if (local_14 == 0xc) {
      local_18 = 0x18;
    }
    if (local_14 == 0xd) {
      local_18 = 0x19;
    }
  }
  pgraph_grobj_set_color_format
            (&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,
             (this->super_SingleMthdTest).super_MthdTest.egrobj,local_18);
  return;
}

Assistant:

void emulate_mthd() override {
		int sfmt = val & 7;
		if (chipset.card_type >= 0x10)
			sfmt = val & 0xf;
		int fmt = 0;
		if (sfmt == 1)
			fmt = 0x6;
		if (sfmt == 2)
			fmt = 0x7;
		if (sfmt == 3)
			fmt = 0xd;
		if (sfmt == 4)
			fmt = 0xe;
		if (sfmt == 5)
			fmt = 0x12;
		if (sfmt == 6)
			fmt = 0x13;
		if (sfmt == 7)
			fmt = 0xa;
		if (sfmt == 8)
			fmt = 0x1;
		if (sfmt == 9)
			fmt = 0x15;
		if (nv04_pgraph_is_nv11p(&chipset)) {
			if (sfmt == 0xa)
				fmt = 0x16;
			if (sfmt == 0xb)
				fmt = 0x17;
		}
		if (chipset.card_type >= 0x30) {
			if (sfmt == 0xc)
				fmt = 0x18;
			if (sfmt == 0xd)
				fmt = 0x19;
		}
		pgraph_grobj_set_color_format(&exp, egrobj, fmt);
	}